

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetPHINFPartNumber(ndicapi *pol,char *part)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    part[lVar1] = pol->PhinfPartNumber[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x14);
  return pol->PhinfUnoccupied;
}

Assistant:

ndicapiExport int ndiGetPHINFPartNumber(ndicapi* pol, char part[20])
{
  char* dp;
  int i;

  dp = pol->PhinfPartNumber;

  for (i = 0; i < 20; i++)
  {
    part[i] = *dp++;
  }

  return pol->PhinfUnoccupied;
}